

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadSections(BinaryReader *this,ReadSectionsOptions *options)

{
  size_t sVar1;
  Result RVar2;
  BinarySectionOrder BVar3;
  BinarySectionOrder BVar4;
  int iVar5;
  Enum EVar6;
  ulong uVar7;
  ulong uVar8;
  char *format;
  char *pcVar9;
  uint uVar10;
  Index num_locals;
  Index index;
  uint32_t name_type;
  Index num_names;
  string_view function_name;
  uint32_t kind;
  Offset subsection_size;
  Index local_index;
  Index num_data_segments;
  uint8_t section_code;
  uint32_t offset;
  undefined4 local_90;
  uint32_t size;
  Index *local_88;
  TypeVector *local_80;
  Index *local_78;
  TypeVector *local_70;
  bool seen_section_code [14];
  Offset section_size;
  
  seen_section_code[8] = false;
  seen_section_code[9] = false;
  seen_section_code[10] = false;
  seen_section_code[0xb] = false;
  seen_section_code[0xc] = false;
  seen_section_code[0xd] = false;
  seen_section_code[0] = false;
  seen_section_code[1] = false;
  seen_section_code[2] = false;
  seen_section_code[3] = false;
  seen_section_code[4] = false;
  seen_section_code[5] = false;
  seen_section_code[6] = false;
  seen_section_code[7] = false;
  local_78 = &this->num_function_bodies_;
  local_88 = &this->num_function_signatures_;
  local_70 = &this->param_types_;
  local_80 = &this->result_types_;
  uVar7 = (this->state_).offset;
  EVar6 = Ok;
  uVar10 = 0;
  while( true ) {
    if ((this->state_).size <= uVar7) {
      return (Result)EVar6;
    }
    RVar2 = ReadU8(this,&section_code,"section code");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    RVar2 = ReadOffset(this,&section_size,"section size");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    sVar1 = this->read_end_;
    uVar7 = (this->state_).offset + section_size;
    this->read_end_ = uVar7;
    uVar8 = (ulong)section_code;
    if (section_code < 0xe) break;
    PrintError(this,"invalid section code: %u");
    if (options->stop_on_first_error != false) goto LAB_00111c93;
    uVar7 = this->read_end_;
    (this->state_).offset = uVar7;
    EVar6 = Error;
    this->read_end_ = sVar1;
    uVar10 = uVar10 + 1;
  }
  if (uVar8 == 0) {
LAB_0010df2b:
    if ((this->state_).size < uVar7) {
      pcVar9 = "invalid section size: extends past end";
    }
    else {
      if (((uint)section_code != Custom) && (this->last_known_section_ != Invalid)) {
        BVar3 = GetSectionOrder((uint)section_code);
        BVar4 = GetSectionOrder(this->last_known_section_);
        if ((int)BVar3 <= (int)BVar4) {
          pcVar9 = GetSectionName((uint)section_code);
          format = "section %s out of order";
          goto LAB_00111c86;
        }
      }
      if ((uVar8 != 0) && (this->did_read_names_section_ != false)) {
        pcVar9 = GetSectionName((uint)section_code);
        format = "%s section can not occur after Name section";
        goto LAB_00111c86;
      }
      iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[6])
                        (this->delegate_,(ulong)uVar10,uVar8,section_size);
      if (iVar5 == 0) {
        local_90 = (undefined4)
                   CONCAT71((int7)(section_size >> 8),this->options_->stop_on_first_error);
        EVar6 = (*(code *)(&DAT_0011f2ec + *(int *)(&DAT_0011f2ec + uVar8 * 4)))();
        return (Result)EVar6;
      }
      pcVar9 = "BeginSection callback failed";
    }
    PrintError(this,pcVar9);
  }
  else {
    if (seen_section_code[uVar8] != true) {
      seen_section_code[uVar8] = true;
      goto LAB_0010df2b;
    }
    pcVar9 = GetSectionName((uint)section_code);
    format = "multiple %s sections";
LAB_00111c86:
    PrintError(this,format,pcVar9);
  }
LAB_00111c93:
  this->read_end_ = sVar1;
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadSections(const ReadSectionsOptions& options) {
  Result result = Result::Ok;
  Index section_index = 0;
  bool seen_section_code[static_cast<int>(BinarySection::Last) + 1] = {false};

  for (; state_.offset < state_.size; ++section_index) {
    uint8_t section_code;
    Offset section_size;
    CHECK_RESULT(ReadU8(&section_code, "section code"));
    CHECK_RESULT(ReadOffset(&section_size, "section size"));
    ReadEndRestoreGuard guard(this);
    read_end_ = state_.offset + section_size;
    if (section_code >= kBinarySectionCount) {
      PrintError("invalid section code: %u", section_code);
      if (options.stop_on_first_error) {
        return Result::Error;
      }
      // If we don't have to stop on first error, continue reading
      // sections, because although we could not understand the
      // current section, we can continue and correctly parse
      // subsequent sections, so we can give back as much information
      // as we can understand.
      result = Result::Error;
      state_.offset = read_end_;
      continue;
    }

    BinarySection section = static_cast<BinarySection>(section_code);
    if (section != BinarySection::Custom) {
      if (seen_section_code[section_code]) {
        PrintError("multiple %s sections", GetSectionName(section));
        return Result::Error;
      }
      seen_section_code[section_code] = true;
    }

    ERROR_UNLESS(read_end_ <= state_.size,
                 "invalid section size: extends past end");

    ERROR_UNLESS(
        last_known_section_ == BinarySection::Invalid ||
            section == BinarySection::Custom ||
            GetSectionOrder(section) > GetSectionOrder(last_known_section_),
        "section %s out of order", GetSectionName(section));

    ERROR_UNLESS(!did_read_names_section_ || section == BinarySection::Custom,
                 "%s section can not occur after Name section",
                 GetSectionName(section));

    CALLBACK(BeginSection, section_index, section, section_size);

    bool stop_on_first_error = options_.stop_on_first_error;
    Result section_result = Result::Error;
    switch (section) {
      case BinarySection::Custom:
        section_result = ReadCustomSection(section_index, section_size);
        if (options_.fail_on_custom_section_error) {
          result |= section_result;
        } else {
          stop_on_first_error = false;
        }
        break;
      case BinarySection::Type:
        section_result = ReadTypeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Import:
        section_result = ReadImportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Function:
        section_result = ReadFunctionSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Table:
        section_result = ReadTableSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Memory:
        section_result = ReadMemorySection(section_size);
        result |= section_result;
        break;
      case BinarySection::Global:
        section_result = ReadGlobalSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Export:
        section_result = ReadExportSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Start:
        section_result = ReadStartSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Elem:
        section_result = ReadElemSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Code:
        section_result = ReadCodeSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Data:
        section_result = ReadDataSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Tag:
        ERROR_UNLESS(options_.features.exceptions_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadTagSection(section_size);
        result |= section_result;
        break;
      case BinarySection::DataCount:
        ERROR_UNLESS(options_.features.bulk_memory_enabled(),
                     "invalid section code: %u",
                     static_cast<unsigned int>(section));
        section_result = ReadDataCountSection(section_size);
        result |= section_result;
        break;
      case BinarySection::Invalid:
        WABT_UNREACHABLE;
    }

    if (Succeeded(section_result) && state_.offset != read_end_) {
      PrintError("unfinished section (expected end: 0x%" PRIzx ")", read_end_);
      section_result = Result::Error;
      result |= section_result;
    }

    if (Failed(section_result)) {
      if (stop_on_first_error) {
        return Result::Error;
      }

      // If we're continuing after failing to read this section, move the
      // offset to the expected section end. This way we may be able to read
      // further sections.
      state_.offset = read_end_;
    }

    if (section != BinarySection::Custom) {
      last_known_section_ = section;
    }
  }

  return result;
}